

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  char cVar1;
  uchar uVar2;
  byte bVar3;
  uchar *puVar4;
  _Bool _Var5;
  int iVar6;
  CURLUcode CVar7;
  Curl_handler *pCVar8;
  size_t sVar9;
  Curl_URL *pCVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  char *pcVar14;
  Curl_URL *pCVar15;
  char cVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  byte bVar20;
  byte bVar21;
  char *oldurl;
  CURLU *local_60;
  long local_58;
  char *local_48;
  ulong local_40;
  CURLU *local_38;
  
  bVar21 = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      goto switchD_001433ef_caseD_0;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      goto LAB_0014396c;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
LAB_0014396c:
    return CURLUE_UNKNOWN_PART;
  }
  bVar20 = (byte)(flags >> 7) & 1;
  switch(what) {
  case CURLUPART_URL:
    _Var5 = Curl_is_absolute_url(part,(char *)0x0,0x29);
    if ((!_Var5) && (CVar7 = curl_url_get(u,CURLUPART_URL,&local_48,flags), CVar7 == CURLUE_OK)) {
      pCVar15 = (Curl_URL *)concat_url(local_48,part);
      (*Curl_cfree)(local_48);
      CVar7 = CURLUE_OUT_OF_MEMORY;
      if (pCVar15 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      pCVar10 = (Curl_URL *)(*Curl_ccalloc)(0x60,1);
      if (pCVar10 != (Curl_URL *)0x0) {
        CVar7 = parseurl((char *)pCVar15,pCVar10,flags);
        (*Curl_cfree)(pCVar15);
        if (CVar7 == CURLUE_OK) {
          free_urlhandle(u);
          pCVar15 = pCVar10;
          for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
            u->scheme = pCVar15->scheme;
            pCVar15 = (Curl_URL *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
            u = (CURLU *)((long)u + (ulong)bVar21 * -0x10 + 8);
          }
          (*Curl_cfree)(pCVar10);
          return CURLUE_OK;
        }
        free_urlhandle(pCVar10);
        pCVar15 = pCVar10;
      }
      (*Curl_cfree)(pCVar15);
      return CVar7;
    }
    pCVar10 = (Curl_URL *)(*Curl_ccalloc)(0x60,1);
    if (pCVar10 == (Curl_URL *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar7 = parseurl(part,pCVar10,flags);
    if (CVar7 == CURLUE_OK) {
      free_urlhandle(u);
      pCVar15 = pCVar10;
      for (lVar11 = 0xc; lVar11 != 0; lVar11 = lVar11 + -1) {
        u->scheme = pCVar15->scheme;
        pCVar15 = (Curl_URL *)((long)pCVar15 + (ulong)bVar21 * -0x10 + 8);
        u = (CURLU *)((long)u + (ulong)bVar21 * -0x10 + 8);
      }
      (*Curl_cfree)(pCVar10);
      return CURLUE_OK;
    }
    free_urlhandle(pCVar10);
    goto LAB_001438b1;
  case CURLUPART_SCHEME:
    sVar9 = strlen(part);
    if (0x28 < sVar9) {
      return CURLUE_MALFORMED_INPUT;
    }
    if (((flags & 8) == 0) && (pCVar8 = Curl_builtin_scheme(part), pCVar8 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar18 = 0;
    bVar21 = 0;
    bVar3 = 0;
    bVar20 = 0;
    local_58 = 0;
    local_60 = u;
    goto LAB_00143545;
  case CURLUPART_USER:
    local_60 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_60 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_60 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_60 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case CURLUPART_PORT:
    local_58 = strtol(part,&local_48,10);
    if (local_58 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*local_48 != '\0') {
      return CURLUE_MALFORMED_INPUT;
    }
    local_60 = (CURLU *)&u->port;
    uVar18 = 0;
    bVar21 = 0;
    bVar3 = 0;
    bVar20 = 0;
    goto LAB_00143545;
  case CURLUPART_PATH:
    local_60 = (CURLU *)&u->path;
    bVar21 = 1;
    goto LAB_00143533;
  case CURLUPART_QUERY:
    uVar17 = flags >> 8;
    local_60 = (CURLU *)&u->query;
    bVar21 = 0;
    bVar3 = bVar20;
    goto LAB_0014353c;
  case CURLUPART_FRAGMENT:
    local_60 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    local_60 = (CURLU *)&u->zoneid;
  }
  bVar21 = 0;
LAB_00143533:
  uVar17 = 0;
  bVar3 = 0;
LAB_0014353c:
  uVar18 = (ulong)uVar17;
  local_58 = 0;
LAB_00143545:
  sVar9 = strlen(part);
  if (8000000 < sVar9) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (bVar20 == 0) {
    pCVar10 = (Curl_URL *)(*Curl_cstrdup)(part);
    pCVar15 = pCVar10;
    if (pCVar10 != (Curl_URL *)0x0) {
      do {
        lVar11 = 1;
        if (*(char *)&pCVar15->scheme == '%') {
          iVar6 = Curl_isxdigit((uint)*(byte *)((long)&pCVar15->scheme + 1));
          if (((iVar6 != 0) &&
              (iVar6 = Curl_isxdigit((uint)*(byte *)((long)&pCVar15->scheme + 2)), iVar6 != 0)) &&
             ((iVar6 = Curl_isupper((uint)*(byte *)((long)&pCVar15->scheme + 1)), iVar6 != 0 ||
              (iVar6 = Curl_isupper((uint)*(byte *)((long)&pCVar15->scheme + 2)), iVar6 != 0)))) {
            iVar6 = tolower((uint)*(byte *)((long)&pCVar15->scheme + 1));
            *(char *)((long)&pCVar15->scheme + 1) = (char)iVar6;
            iVar6 = tolower((uint)*(byte *)((long)&pCVar15->scheme + 2));
            *(char *)((long)&pCVar15->scheme + 2) = (char)iVar6;
            lVar11 = 3;
          }
        }
        else if (*(char *)&pCVar15->scheme == '\0') goto LAB_0014375d;
        pCVar15 = (Curl_URL *)((long)&pCVar15->scheme + lVar11);
      } while( true );
    }
  }
  else {
    pCVar10 = (Curl_URL *)(*Curl_cmalloc)(sVar9 * 3 + 1);
    CVar7 = CURLUE_OUT_OF_MEMORY;
    if (pCVar10 == (Curl_URL *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    if (bVar3 != 0) {
      lVar11 = 0;
      while( true ) {
        cVar1 = part[lVar11];
        cVar16 = '+';
        if ((cVar1 != ' ') && (cVar16 = cVar1, cVar1 == '\0')) break;
        *(char *)((long)&pCVar10->scheme + lVar11) = cVar16;
        lVar11 = lVar11 + 1;
      }
      *(undefined1 *)((long)&pCVar10->scheme + lVar11) = 0;
      part = (*Curl_cstrdup)((char *)pCVar10);
      if ((uchar *)part == (uchar *)0x0) {
LAB_001438b1:
        (*Curl_cfree)(pCVar10);
        return CVar7;
      }
    }
    uVar2 = *part;
    pCVar15 = pCVar10;
    local_40 = uVar18;
    puVar4 = (uchar *)part;
    while (local_38 = u, uVar2 != '\0') {
      _Var5 = Curl_isunreserved(uVar2);
      uVar2 = *puVar4;
      if ((bool)(uVar2 == '/' & bVar21) || _Var5) {
LAB_001436d5:
        uVar12 = uVar18 & 0xff;
        uVar19 = uVar12;
        if ((uVar18 & 1) != 0) {
          uVar19 = 0;
        }
        uVar18 = uVar19;
        if (uVar2 != '=') {
          uVar18 = uVar12;
        }
        *(uchar *)&pCVar15->scheme = uVar2;
        lVar11 = 1;
      }
      else {
        if (uVar2 != '=') {
          if (uVar2 != '+' || bVar3 != 1) goto LAB_0014370e;
          goto LAB_001436d5;
        }
        if ((uVar18 & 1) != 0) goto LAB_001436d5;
LAB_0014370e:
        curl_msnprintf((char *)pCVar15,4,"%%%02x");
        lVar11 = 3;
      }
      pCVar15 = (Curl_URL *)((long)&pCVar15->scheme + lVar11);
      uVar2 = puVar4[1];
      u = local_38;
      puVar4 = puVar4 + 1;
    }
    *(char *)&pCVar15->scheme = '\0';
    uVar18 = local_40;
    if (bVar3 != 0) {
      (*Curl_cfree)(part);
      uVar18 = local_40;
      u = local_38;
    }
LAB_0014375d:
    if ((((uVar18 & 1) == 0) || (pcVar14 = u->query, pcVar14 == (char *)0x0)) ||
       (sVar9 = strlen(pcVar14), sVar9 == 0)) {
      if ((what == CURLUPART_HOST) &&
         (CVar7 = hostname_check(u,(char *)pCVar10), CVar7 != CURLUE_OK)) {
        (*Curl_cfree)(pCVar10);
        return CURLUE_MALFORMED_INPUT;
      }
      (*Curl_cfree)(local_60->scheme);
      local_60->scheme = (char *)pCVar10;
      if (local_58 != 0) {
        u->portnum = local_58;
        return CURLUE_OK;
      }
      return CURLUE_OK;
    }
    cVar1 = pcVar14[sVar9 - 1];
    sVar13 = strlen((char *)pCVar10);
    lVar11 = (cVar1 != '&') + sVar9;
    pcVar14 = (char *)(*Curl_cmalloc)(sVar13 + lVar11 + 1);
    if (pcVar14 != (char *)0x0) {
      strcpy(pcVar14,u->query);
      if (cVar1 != '&') {
        pcVar14[sVar9] = '&';
      }
      strcpy(pcVar14 + lVar11,(char *)pCVar10);
      (*Curl_cfree)(pCVar10);
      (*Curl_cfree)(local_60->scheme);
      local_60->scheme = pcVar14;
switchD_001433ef_caseD_0:
      return CURLUE_OK;
    }
    (*Curl_cfree)(pCVar10);
  }
  return CURLUE_OUT_OF_MEMORY;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_MALFORMED_INPUT;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    free(u->zoneid);
    u->zoneid = NULL;
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_MALFORMED_INPUT;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN + 1)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = (const unsigned char *)part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = (const unsigned char *)part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && equalsencode) ||
           ((*i == '+') && plusencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          *o = *i;
          o++;
        }
        else {
          msnprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    if(what == CURLUPART_HOST) {
      if(hostname_check(u, (char *)newp)) {
        free((char *)newp);
        return CURLUE_MALFORMED_INPUT;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}